

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void __thiscall
fmt::v11::detail::file_print_buffer<_IO_FILE,_void>::file_print_buffer
          (file_print_buffer<_IO_FILE,_void> *this,_IO_FILE *f)

{
  FILE *in_RSI;
  _IO_FILE *in_RDI;
  span<char> sVar1;
  span<char> buf;
  glibc_file<_IO_FILE> *in_stack_ffffffffffffffe0;
  size_t local_18;
  
  buffer<char>::buffer((buffer<char> *)in_RDI,grow,0);
  glibc_file<_IO_FILE>::file_base(in_stack_ffffffffffffffe0,in_RDI);
  flockfile(in_RSI);
  glibc_file<_IO_FILE>::init_buffer((glibc_file<_IO_FILE> *)in_RDI);
  sVar1 = glibc_file<_IO_FILE>::get_write_buffer(in_stack_ffffffffffffffe0);
  local_18 = sVar1.size;
  buffer<char>::set((buffer<char> *)in_RDI,sVar1.data,local_18);
  return;
}

Assistant:

explicit file_print_buffer(F* f) : buffer(grow, size_t()), file_(f) {
    flockfile(f);
    file_.init_buffer();
    auto buf = file_.get_write_buffer();
    set(buf.data, buf.size);
  }